

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.c
# Opt level: O2

Class objc_allocateClassPair(Class superclass,char *name,size_t extraBytes)

{
  id poVar1;
  Class poVar2;
  Class poVar3;
  Class poVar4;
  char *pcVar5;
  long lVar6;
  Class poVar7;
  
  poVar1 = objc_lookUpClass(name);
  if ((poVar1 == (id)0x0) &&
     (poVar2 = (Class)(*gc->malloc)(extraBytes + 0x88), poVar2 != (Class)0x0)) {
    poVar3 = (Class)(*gc->malloc)(0x88);
    poVar4 = poVar3;
    poVar7 = poVar2;
    if (superclass != (Class)0x0) {
      poVar4 = superclass->isa;
      poVar7 = poVar4;
    }
    poVar3->isa = poVar4;
    poVar3->super_class = poVar7;
    pcVar5 = strdup(name);
    poVar3->name = pcVar5;
    poVar3->info = 0x401;
    poVar3->dtable = uninstalled_dtable;
    poVar3->instance_size = 0x88;
    poVar2->isa = poVar3;
    poVar2->super_class = superclass;
    pcVar5 = strdup(name);
    poVar2->name = pcVar5;
    poVar2->info = 0x400;
    poVar2->dtable = uninstalled_dtable;
    poVar2->abi_version = 2;
    poVar3->abi_version = 2;
    if (superclass == (Class)0x0) {
      lVar6 = 8;
    }
    else {
      lVar6 = superclass->instance_size;
    }
    poVar2->instance_size = lVar6;
    return poVar2;
  }
  return (Class)0x0;
}

Assistant:

Class objc_allocateClassPair(Class superclass, const char *name, size_t extraBytes)
{
	// Check the class doesn't already exist.
	if (nil != objc_lookUpClass(name)) { return Nil; }

	Class newClass = gc->malloc(sizeof(struct objc_class) + extraBytes);

	if (Nil == newClass) { return Nil; }

	// Create the metaclass
	Class metaClass = gc->malloc(sizeof(struct objc_class));

	if (Nil == superclass)
	{
		/*
		 * Metaclasses of root classes are precious little flowers and work a
		 * little differently:
		 */
		metaClass->isa = metaClass;
		metaClass->super_class = newClass;
	}
	else
	{
		// Initialize the metaclass
		// Set the meta-metaclass pointer to the name.  The runtime will fix this
		// in objc_resolve_class().
		// If the superclass is not yet resolved, then we need to look it up
		// via the class table.
		metaClass->isa = superclass->isa;
		metaClass->super_class = superclass->isa;
	}
	metaClass->name = strdup(name);
	metaClass->info = objc_class_flag_meta | objc_class_flag_user_created;
	metaClass->dtable = uninstalled_dtable;
	metaClass->instance_size = sizeof(struct objc_class);

	// Set up the new class
	newClass->isa = metaClass;
	newClass->super_class = superclass;

	newClass->name = strdup(name);
	newClass->info = objc_class_flag_user_created;
	newClass->dtable = uninstalled_dtable;

	newClass->abi_version = 2;
	metaClass->abi_version = 2;

	if (Nil == superclass)
	{
		newClass->instance_size = sizeof(struct objc_class*);
	}
	else
	{
		newClass->instance_size = superclass->instance_size;
	}

	return newClass;
}